

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefDoValidityCheckingDefaultValue(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(xmlThrDefMutex);
  iVar1 = xmlDoValidityCheckingDefaultValueThrDef;
  xmlDoValidityCheckingDefaultValueThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefDoValidityCheckingDefaultValue(int v) {
    int ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlDoValidityCheckingDefaultValueThrDef;
    xmlDoValidityCheckingDefaultValueThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}